

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithread.c
# Opt level: O0

int main(void)

{
  int iVar1;
  PmDeviceInfo *pPVar2;
  size_t sVar3;
  char *pcVar4;
  uint local_88;
  int len;
  int input;
  int32_t msg;
  int done;
  int spin;
  char line [80];
  PmDeviceInfo *info;
  uint local_10;
  int32_t n;
  int id;
  
  n = 0;
  input = 0;
  printf("begin PortMidi multithread test...\n");
  midi_to_main = Pm_QueueCreate(0x20,4);
  if (midi_to_main == (PmQueue *)0x0) {
    __assert_fail("midi_to_main != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithread.c"
                  ,0xc5,"int main()");
  }
  main_to_midi = Pm_QueueCreate(0x20,4);
  if (main_to_midi == (PmQueue *)0x0) {
    __assert_fail("main_to_midi != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithread.c"
                  ,199,"int main()");
  }
  info._4_4_ = 0x499602d2;
  Pm_Enqueue(midi_to_main,(void *)((long)&info + 4));
  info._4_4_ = 0x3ade68b1;
  Pm_Enqueue(midi_to_main,(void *)((long)&info + 4));
  Pm_Dequeue(midi_to_main,(void *)((long)&info + 4));
  if (info._4_4_ != 0x499602d2) {
    exit_with_message("Pm_Dequeue produced unexpected result.");
  }
  Pm_Dequeue(midi_to_main,(void *)((long)&info + 4));
  if (info._4_4_ != 0x3ade68b1) {
    exit_with_message("Pm_Dequeue produced unexpected result.");
  }
  Pt_Start(1,process_midi,(void *)0x0);
  Pm_Initialize();
  local_10 = Pm_GetDefaultOutputDeviceID();
  pPVar2 = Pm_GetDeviceInfo(local_10);
  if (pPVar2 == (PmDeviceInfo *)0x0) {
    printf("Could not open default output device (%d).",(ulong)local_10);
    exit_with_message("");
  }
  printf("Opening output device %s %s\n",pPVar2->interf,pPVar2->name);
  Pm_OpenOutput(&midi_out,local_10,(void *)0x0,100,(PmTimeProcPtr)0x0,(void *)0x0,0);
  local_10 = Pm_GetDefaultInputDeviceID();
  pPVar2 = Pm_GetDeviceInfo(local_10);
  if (pPVar2 == (PmDeviceInfo *)0x0) {
    printf("Could not open default input device (%d).",(ulong)local_10);
    exit_with_message("");
  }
  printf("Opening input device %s %s\n",pPVar2->interf,pPVar2->name);
  Pm_OpenInput(&midi_in,local_10,(void *)0x0,0,(PmTimeProcPtr)0x0,(void *)0x0);
  active = 1;
  printf("Enter midi input; it will be transformed as specified by...\n");
  printf("%s\n%s\n%s\n","Type \'q\' to quit, \'m\' to monitor next pitch, t to toggle thru or",
         "type a number to specify transposition.","Must terminate with [ENTER]");
  while (input == 0) {
    fgets((char *)&done,0x50,_stdin);
    sVar3 = strlen((char *)&done);
    if (0 < (int)sVar3) {
      *(undefined1 *)((long)&done + (long)((int)sVar3 + -1)) = 0;
    }
    iVar1 = strcmp((char *)&done,"q");
    if (iVar1 == 0) {
      len = 1000;
      Pm_Enqueue(main_to_midi,&len);
      do {
        msg = Pm_Dequeue(midi_to_main,&len);
      } while (msg == pmNoData);
      input = 1;
    }
    else {
      iVar1 = strcmp((char *)&done,"m");
      if (iVar1 == 0) {
        len = 0x3e9;
        Pm_Enqueue(main_to_midi,&len);
        printf("Waiting for note...\n");
        do {
          msg = Pm_Dequeue(midi_to_main,&len);
        } while (msg == pmNoData);
        printf("... pitch is %ld\n",(long)len);
      }
      else {
        iVar1 = strcmp((char *)&done,"t");
        if (iVar1 == 0) {
          pcVar4 = "on";
          if (midi_thru != 0) {
            pcVar4 = "off";
          }
          printf("Setting THRU %s\n",pcVar4);
          len = 0x3ea;
          Pm_Enqueue(main_to_midi,&len);
        }
        else {
          iVar1 = __isoc99_sscanf(&done,"%d",&local_88);
          if (iVar1 == 1) {
            if (((int)local_88 < -0x7f) || (0x7f < (int)local_88)) {
              printf("Transposition must be within -127...127\n");
            }
            else {
              printf("Transposing by %d\n",(ulong)local_88);
              len = local_88;
              Pm_Enqueue(main_to_midi,&len);
            }
          }
          else {
            printf("%s\n%s\n","Type \'q[ENTER]\' to quit, \'m[ENTER]\' to monitor next pitch, or",
                   "enter a number to specify transposition.");
          }
        }
      }
    }
  }
  Pt_Stop();
  Pm_QueueDestroy(midi_to_main);
  Pm_QueueDestroy(main_to_midi);
  Pm_Close(midi_in);
  Pm_Close(midi_out);
  printf("finished portMidi multithread test...enter any character to quit [RETURN]...");
  fgets((char *)&done,0x50,_stdin);
  return 0;
}

Assistant:

int main()
{
    int id;
    int32_t n;
    const PmDeviceInfo *info;
    char line[STRING_MAX];
    int spin;
    int done = FALSE;

    /* determine what type of test to run */
    printf("begin PortMidi multithread test...\n");
	
    /* note that it is safe to call PortMidi from the main thread for
       initialization and opening devices. You should not make any
       calls to PortMidi from this thread once the midi thread begins.
       to make PortMidi calls.
     */

    /* make the message queues */
    /* messages can be of any size and any type, but all messages in
     * a given queue must have the same size. We'll just use int32_t's
     * for our messages in this simple example
     */
    midi_to_main = Pm_QueueCreate(32, sizeof(int32_t));
    assert(midi_to_main != NULL);
    main_to_midi = Pm_QueueCreate(32, sizeof(int32_t));
    assert(main_to_midi != NULL);

    /* a little test of enqueue and dequeue operations. Ordinarily, 
     * you would call Pm_Enqueue from one thread and Pm_Dequeue from
     * the other. Since the midi thread is not running, this is safe.
     */
    n = 1234567890;
    Pm_Enqueue(midi_to_main, &n);
    n = 987654321;
    Pm_Enqueue(midi_to_main, &n);
	Pm_Dequeue(midi_to_main, &n);
	if (n != 1234567890) {
        exit_with_message("Pm_Dequeue produced unexpected result.");
    }
    Pm_Dequeue(midi_to_main, &n);
	if(n != 987654321) {
        exit_with_message("Pm_Dequeue produced unexpected result.");
    }

    /* always start the timer before you start midi */
    Pt_Start(1, &process_midi, 0); /* start a timer with millisecond accuracy */
    /* the timer will call our function, process_midi() every millisecond */
    
	Pm_Initialize();

    id = Pm_GetDefaultOutputDeviceID();
    info = Pm_GetDeviceInfo(id);
    if (info == NULL) {
        printf("Could not open default output device (%d).", id);
        exit_with_message("");
    }
    printf("Opening output device %s %s\n", info->interf, info->name);

    /* use zero latency because we want output to be immediate */
    Pm_OpenOutput(&midi_out, 
                  id, 
                  DRIVER_INFO,
                  OUTPUT_BUFFER_SIZE,
                  TIME_PROC,
                  TIME_INFO,
                  LATENCY);

    id = Pm_GetDefaultInputDeviceID();
    info = Pm_GetDeviceInfo(id);
    if (info == NULL) {
        printf("Could not open default input device (%d).", id);
        exit_with_message("");
    }
    printf("Opening input device %s %s\n", info->interf, info->name);
    Pm_OpenInput(&midi_in,
                 id,
                 DRIVER_INFO,
                 INPUT_BUFFER_SIZE,
                 TIME_PROC,
                 TIME_INFO);

    active = TRUE; /* enable processing in the midi thread -- yes, this
                      is a shared variable without synchronization, but
                      this simple assignment is safe */

    printf("Enter midi input; it will be transformed as specified by...\n");
    printf("%s\n%s\n%s\n",
           "Type 'q' to quit, 'm' to monitor next pitch, t to toggle thru or",
           "type a number to specify transposition.",
		   "Must terminate with [ENTER]");

    while (!done) {
        int32_t msg;
        int input;
        int len;
        fgets(line, STRING_MAX, stdin);
        /* remove the newline: */
        len = (int)strlen(line);
        if (len > 0) line[len - 1] = 0; /* overwrite the newline char */
        if (strcmp(line, "q") == 0) {
            msg = QUIT_MSG;
            Pm_Enqueue(main_to_midi, &msg);
            /* wait for acknowlegement */
            do {
                spin = Pm_Dequeue(midi_to_main, &msg);
            } while (spin == 0); /* spin */ ;
            done = TRUE; /* leave the command loop and wrap up */
        } else if (strcmp(line, "m") == 0) {
            msg = MONITOR_MSG;
            Pm_Enqueue(main_to_midi, &msg);
            printf("Waiting for note...\n");
            do {
                spin = Pm_Dequeue(midi_to_main, &msg);
            } while (spin == 0); /* spin */ ;
            // convert int32_t to long for safe printing
            printf("... pitch is %ld\n", (long) msg);
        } else if (strcmp(line, "t") == 0) {
            /* reading midi_thru asynchronously could give incorrect results,
               e.g. if you type "t" twice before the midi thread responds to
               the first one, but we'll do it this way anyway. Perhaps a more
               correct way would be to wait for an acknowledgement message
               containing the new state. */
            printf("Setting THRU %s\n", (midi_thru ? "off" : "on"));
            msg = THRU_MSG;
            Pm_Enqueue(main_to_midi, &msg);
        } else if (sscanf(line, "%d", &input) == 1) {
            if (input >= -127 && input <= 127) {
                /* send transposition value, make sur */
                printf("Transposing by %d\n", input);
                msg = (int32_t) input;
                Pm_Enqueue(main_to_midi, &msg);
            } else {
                printf("Transposition must be within -127...127\n");
            }
        } else {
            printf("%s\n%s\n",
              "Type 'q[ENTER]' to quit, 'm[ENTER]' to monitor next pitch, or",
              "enter a number to specify transposition.");
        }
    }

    /* at this point, midi thread is inactive and we need to shut down
     * the midi input and output
     */
    Pt_Stop(); /* stop the timer */
    Pm_QueueDestroy(midi_to_main);
    Pm_QueueDestroy(main_to_midi);

    /* Belinda! if close fails here, some memory is deleted, right??? */
    Pm_Close(midi_in);
    Pm_Close(midi_out);
    
    printf("finished portMidi multithread test...enter any character to quit [RETURN]...");
    fgets(line, STRING_MAX, stdin);
    return 0;
}